

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int mbedtls_ssl_flush_output(mbedtls_ssl_context *ssl)

{
  uchar *puVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  int line;
  uint uVar5;
  int iVar6;
  
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x970,"=> flush output");
  if (ssl->f_send == (mbedtls_ssl_send_t *)0x0) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x975,"Bad usage of mbedtls_ssl_set_bio() or mbedtls_ssl_set_bio()");
    iVar6 = -0x7100;
  }
  else {
    sVar4 = ssl->out_left;
    if (sVar4 == 0) {
      line = 0x97c;
    }
    else {
      while (sVar4 != 0) {
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0x983,"message length: %d, out_left: %d",
                   ssl->out_msglen + (ulong)(*(uint *)&ssl->conf->field_0x174 & 2) * 4 + 5,sVar4);
        uVar2 = (*ssl->f_send)(ssl->p_bio,
                               ssl->out_hdr +
                               ((ssl->out_msglen + (ulong)(*(uint *)&ssl->conf->field_0x174 & 2) * 4
                                ) - ssl->out_left) + 5,ssl->out_left);
        mbedtls_debug_print_ret
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0x989,"ssl->f_send",uVar2);
        if ((int)uVar2 < 1) {
          return uVar2;
        }
        sVar4 = ssl->out_left - (ulong)uVar2;
        ssl->out_left = sVar4;
      }
      uVar2 = 8;
      do {
        uVar5 = *(uint *)&ssl->conf->field_0x174 & 2;
        uVar3 = uVar2 & 0xff;
        if (uVar3 <= uVar5) goto LAB_00112016;
        uVar2 = uVar3 - 1;
        puVar1 = ssl->out_ctr + ((ulong)uVar3 - 1);
        *puVar1 = *puVar1 + '\x01';
      } while (*puVar1 == '\0');
      uVar5 = *(uint *)&ssl->conf->field_0x174 & 2;
LAB_00112016:
      if (uVar5 == uVar3) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0x998,"outgoing message counter would wrap");
        return -0x6b80;
      }
      line = 0x99c;
    }
    iVar6 = 0;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,line,"<= flush output");
  }
  return iVar6;
}

Assistant:

int mbedtls_ssl_flush_output( mbedtls_ssl_context *ssl )
{
    int ret;
    unsigned char *buf, i;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> flush output" ) );

    if( ssl->f_send == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "Bad usage of mbedtls_ssl_set_bio() "
                            "or mbedtls_ssl_set_bio()" ) );
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    /* Avoid incrementing counter if data is flushed */
    if( ssl->out_left == 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= flush output" ) );
        return( 0 );
    }

    while( ssl->out_left > 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "message length: %d, out_left: %d",
                       mbedtls_ssl_hdr_len( ssl ) + ssl->out_msglen, ssl->out_left ) );

        buf = ssl->out_hdr + mbedtls_ssl_hdr_len( ssl ) +
              ssl->out_msglen - ssl->out_left;
        ret = ssl->f_send( ssl->p_bio, buf, ssl->out_left );

        MBEDTLS_SSL_DEBUG_RET( 2, "ssl->f_send", ret );

        if( ret <= 0 )
            return( ret );

        ssl->out_left -= ret;
    }

    for( i = 8; i > ssl_ep_len( ssl ); i-- )
        if( ++ssl->out_ctr[i - 1] != 0 )
            break;

    /* The loop goes to its end iff the counter is wrapping */
    if( i == ssl_ep_len( ssl ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "outgoing message counter would wrap" ) );
        return( MBEDTLS_ERR_SSL_COUNTER_WRAPPING );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= flush output" ) );

    return( 0 );
}